

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution2d.cpp
# Opt level: O0

int __thiscall embree::Distribution2D::init(Distribution2D *this,EVP_PKEY_CTX *ctx)

{
  float fVar1;
  int extraout_EAX;
  reference pvVar2;
  reference this_00;
  EVP_PKEY_CTX *ctx_00;
  size_t in_RCX;
  size_t in_RDX;
  size_t x;
  size_t y;
  vector<float,_std::allocator<float>_> fy;
  allocator_type *__a;
  size_type in_stack_ffffffffffffff98;
  undefined1 *__n;
  vector<embree::Distribution1D,_std::allocator<embree::Distribution1D>_> *in_stack_ffffffffffffffa0
  ;
  ulong uVar3;
  ulong local_58;
  undefined1 local_39;
  vector<float,_std::allocator<float>_> local_38;
  size_t local_18;
  EVP_PKEY_CTX *local_10;
  Distribution2D *local_8;
  
  this->width = in_RDX;
  this->height = in_RCX;
  local_18 = in_RDX;
  local_10 = ctx;
  local_8 = this;
  std::vector<embree::Distribution1D,_std::allocator<embree::Distribution1D>_>::resize
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  __a = (allocator_type *)this->height;
  __n = &local_39;
  std::allocator<float>::allocator((allocator<float> *)0x128d69);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffffa0,(size_type)__n,__a);
  std::allocator<float>::~allocator((allocator<float> *)0x128d89);
  for (local_58 = 0; local_58 < this->height; local_58 = local_58 + 1) {
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,local_58);
    *pvVar2 = 0.0;
    for (uVar3 = 0; uVar3 < this->width; uVar3 = uVar3 + 1) {
      fVar1 = *(float *)(local_10 + (local_58 * local_18 + uVar3) * 4);
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,local_58);
      *pvVar2 = fVar1 + *pvVar2;
    }
    this_00 = std::vector<embree::Distribution1D,_std::allocator<embree::Distribution1D>_>::
              operator[](&this->xDists,local_58);
    Distribution1D::init(this_00,local_10 + local_58 * this->width * 4);
  }
  ctx_00 = (EVP_PKEY_CTX *)
           std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)0x128ebb);
  Distribution1D::init(&this->yDist,ctx_00);
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)__a);
  return extraout_EAX;
}

Assistant:

void Distribution2D::init(const float* f, const size_t w, const size_t h)
  {
    /*! create arrays */
    width = w; height = h;
    xDists.resize(height);
    std::vector<float> fy(height);

    /*! compute y distribution and initialize row distributions */
    for (size_t y=0; y<height; y++)
    {
      /*! accumulate row to compute y distribution */
      fy[y] = 0.0f;
      for (size_t x=0; x<width; x++)
        fy[y] += f[y*w+x];

      /*! initialize distribution for current row */
      xDists[y].init(f+y*width, width);
    }

    /*! initializes the y distribution */
    yDist.init(fy.data(), height);
  }